

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCutUtils.c
# Opt level: O2

void Map_CutListRecycle(Map_Man_t *p,Map_Cut_t *pSetList,Map_Cut_t *pSave)

{
  Map_Cut_t *pMVar1;
  Map_Cut_t *pMVar2;
  
  if (pSetList == (Map_Cut_t *)0x0) {
    pMVar1 = (Map_Cut_t *)0x0;
  }
  else {
    pMVar1 = pSetList->pNext;
  }
  while (pMVar2 = pMVar1, pSetList != (Map_Cut_t *)0x0) {
    if (pSetList != pSave) {
      Extra_MmFixedEntryRecycle(p->mmCuts,(char *)pSetList);
    }
    pMVar1 = (Map_Cut_t *)0x0;
    pSetList = pMVar2;
    if (pMVar2 != (Map_Cut_t *)0x0) {
      pMVar1 = pMVar2->pNext;
    }
  }
  return;
}

Assistant:

void Map_CutListRecycle( Map_Man_t * p, Map_Cut_t * pSetList, Map_Cut_t * pSave )
{
    Map_Cut_t * pNext, * pTemp;
    for ( pTemp = pSetList, pNext = pTemp? pTemp->pNext : NULL; 
          pTemp; 
          pTemp = pNext, pNext = pNext? pNext->pNext : NULL )
        if ( pTemp != pSave )
            Extra_MmFixedEntryRecycle( p->mmCuts, (char *)pTemp );
}